

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_> * __thiscall
testing::ByMove<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>>
          (ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>
           *__return_storage_ptr__,testing *this,
          unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> *x)

{
  unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> local_40;
  testing *local_18;
  unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> *x_local;
  
  local_18 = this;
  x_local = &__return_storage_ptr__->payload;
  std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>::unique_ptr
            (&local_40,(unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> *)this);
  internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>::
  ByMoveWrapper(__return_storage_ptr__,&local_40);
  std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>::~unique_ptr(&local_40);
  return __return_storage_ptr__;
}

Assistant:

internal::ByMoveWrapper<R> ByMove(R x) {
  return internal::ByMoveWrapper<R>(std::move(x));
}